

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManCountMark0Dfs_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  uVar2 = 0;
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = *(uint *)(p->pObjs + (uint)iObj);
    if ((int)uVar2 < 0 || (~uVar2 & 0x1fffffff) == 0) {
      uVar2 = uVar2 >> 0x1e & 1;
    }
    else {
      pGVar1 = p->pObjs + (uint)iObj;
      iVar3 = Gia_ManCountMark0Dfs_rec(p,iObj - (uVar2 & 0x1fffffff));
      iVar4 = Gia_ManCountMark0Dfs_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
      uVar2 = iVar4 + iVar3 + (uint)((*(uint *)pGVar1 >> 0x1e & 1) != 0);
    }
  }
  return uVar2;
}

Assistant:

int Gia_ManCountMark0Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( !Gia_ObjIsAnd(pObj) )
        return pObj->fMark0;
    return Gia_ManCountMark0Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) ) + 
           Gia_ManCountMark0Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) ) + pObj->fMark0;
}